

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CRotationZ<std::complex<double>_>::update
          (CRotationZ<std::complex<double>_> *this,rotation_type *rot)

{
  RotationZ<std::complex<double>_> *pRVar1;
  double dVar2;
  char cVar3;
  
  pRVar1 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_false>.
           _M_head_impl;
  cVar3 = (**(code **)(*(long *)&(pRVar1->super_QRotationGate1<std::complex<double>_>).
                                 super_QGate1<std::complex<double>_> + 8))(pRVar1);
  if (cVar3 == '\0') {
    dVar2 = (rot->angle_).sin_;
    (pRVar1->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_ = (rot->angle_).cos_
    ;
    *(double *)((long)&(pRVar1->super_QRotationGate1<std::complex<double>_>).rotation_ + 8) = dVar2;
    return;
  }
  __assert_fail("!fixed()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QRotationGate1.hpp"
                ,0x78,
                "void qclab::qgates::QRotationGate1<std::complex<double>>::update(const rotation_type &) [T = std::complex<double>]"
               );
}

Assistant:

void update( const rotation_type& rot ) { gate_->update( rot ) ; }